

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_string_hash(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  operand local_2cc;
  operation local_2c8;
  operand local_2c4;
  operation local_2c0;
  operand local_2bc;
  operation local_2b8 [2];
  operand local_2b0 [2];
  operation local_2a8 [2];
  operand local_2a0 [2];
  operation local_298;
  operand local_294 [2];
  operation local_28c [2];
  operand local_284 [2];
  operation local_27c;
  operand local_278 [2];
  operation local_270 [2];
  operand local_268 [2];
  operation local_260;
  operand local_25c [2];
  operation local_254 [2];
  operand local_24c [2];
  operation local_244;
  operand local_240 [2];
  operation local_238 [2];
  operand local_230 [2];
  operation local_228;
  operand local_224 [2];
  operation local_21c [2];
  operand local_214 [2];
  operation local_20c;
  operand local_208 [2];
  operation local_200 [2];
  operand local_1f8 [2];
  operation local_1f0;
  operand local_1ec [2];
  operation local_1e4 [2];
  operand local_1dc [2];
  operation local_1d4;
  operand local_1d0 [2];
  operation local_1c8 [4];
  operand local_1b8 [2];
  operation local_1b0;
  operand local_1ac;
  operation local_1a8;
  operand local_1a4 [2];
  operation local_19c;
  operand local_198;
  operation local_194;
  operand local_190 [2];
  operation local_188 [2];
  operand local_180 [2];
  operation local_178 [2];
  undefined1 local_170 [8];
  string done;
  string repeat;
  operand local_128;
  operation local_124;
  operand local_120;
  operation local_11c;
  long local_118;
  operand local_10c [2];
  operation local_104;
  operand local_100;
  operation local_fc [2];
  operand local_f4 [2];
  operation local_ec;
  operand local_e8 [2];
  operation local_e0 [2];
  operand local_d8 [2];
  operation local_d0;
  operand local_cc [2];
  operation local_c4;
  long local_c0;
  operand local_b8 [2];
  operation local_b0;
  operand local_ac [2];
  operation local_a4;
  operand local_a0;
  operation local_9c;
  operand local_98;
  operation local_94;
  unsigned_long local_90;
  operand local_84 [2];
  operation local_7c [3];
  operand local_70 [2];
  operation local_68 [4];
  string local_58;
  undefined1 local_38 [8];
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  error.field_2._8_8_ = ops;
  std::__cxx11::string::string((string *)local_38);
  psVar1 = label;
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_58,psVar1,lab);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    local_68[0] = CMP;
    local_70[1] = 0x14;
    local_70[0] = NUMBER;
    local_7c[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_68,local_70 + 1,local_70,(int *)(local_7c + 2));
    local_7c[1] = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_7c + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    jump_if_arg_is_not_block(code,RCX,R11,(string *)local_38);
  }
  local_7c[0] = AND;
  local_84[1] = 0xb;
  local_84[0] = NUMBER;
  local_90 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_7c,local_84 + 1,local_84,&local_90);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    jump_if_arg_does_not_point_to_string(code,RCX,R11,(string *)local_38);
  }
  local_94 = PUSH;
  local_98 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_94,&local_98);
  local_9c = PUSH;
  local_a0 = RDX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_9c,&local_a0);
  local_a4 = MOV;
  local_ac[1] = 0x14;
  local_ac[0] = MEM_RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_a4,local_ac + 1,local_ac);
  local_b0 = MOV;
  local_b8[1] = 9;
  local_b8[0] = NUMBER;
  local_c0 = 0xffffffffffffff;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
            (code,&local_b0,local_b8 + 1,local_b8,&local_c0);
  local_c4 = AND;
  local_cc[1] = 0x14;
  local_cc[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_c4,local_cc + 1,local_cc);
  local_d0 = ADD;
  local_d8[1] = 0xb;
  local_d8[0] = NUMBER;
  local_e0[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_d0,local_d8 + 1,local_d8,(int *)(local_e0 + 1));
  local_e0[0] = MOV;
  local_e8[1] = 9;
  local_e8[0] = MEM_RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_e0,local_e8 + 1,local_e8);
  local_ec = ADD;
  local_f4[1] = 0xb;
  local_f4[0] = NUMBER;
  local_fc[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_ec,local_f4 + 1,local_f4,(int *)(local_fc + 1));
  local_fc[0] = DEC;
  local_100 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_fc,&local_100);
  local_104 = MOV;
  local_10c[1] = 0x18;
  local_10c[0] = NUMBER;
  local_118 = 0xd088016b;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
            (code,&local_104,local_10c + 1,local_10c,&local_118);
  local_11c = MUL;
  local_120 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_11c,&local_120);
  local_124 = MOV;
  local_128 = RBX;
  repeat.field_2._12_4_ = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_124,&stack0xfffffffffffffed8,(operand *)(repeat.field_2._M_local_buf + 0xc)
            );
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&done.field_2 + 8),psVar1,lab_00);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_170,psVar1,lab_01);
  local_178[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_178 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done.field_2 + 8));
  local_178[0] = TEST;
  local_180[1] = 0x14;
  local_180[0] = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_178,local_180 + 1,local_180);
  local_188[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_188 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
  local_188[0] = MOV;
  local_190[1] = 9;
  local_190[0] = MEM_RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_188,local_190 + 1,local_190);
  local_194 = MUL;
  local_198 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_194,&local_198);
  local_19c = XOR;
  local_1a4[1] = 10;
  local_1a4[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_19c,local_1a4 + 1,local_1a4);
  local_1a8 = DEC;
  local_1ac = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_1a8,&local_1ac);
  local_1b0 = ADD;
  local_1b8[1] = 0xb;
  local_1b8[0] = NUMBER;
  local_1c8[3] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1b0,local_1b8 + 1,local_1b8,(int *)(local_1c8 + 3));
  local_1c8[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1c8 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done.field_2 + 8));
  local_1c8[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1c8 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
  local_1c8[0] = MOV;
  local_1d0[1] = 9;
  local_1d0[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_1c8,local_1d0 + 1,local_1d0);
  local_1d4 = SHR;
  local_1dc[1] = 10;
  local_1dc[0] = NUMBER;
  local_1e4[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1d4,local_1dc + 1,local_1dc,(int *)(local_1e4 + 1));
  local_1e4[0] = XOR;
  local_1ec[1] = 9;
  local_1ec[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_1e4,local_1ec + 1,local_1ec);
  local_1f0 = SHR;
  local_1f8[1] = 10;
  local_1f8[0] = NUMBER;
  local_200[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1f0,local_1f8 + 1,local_1f8,(int *)(local_200 + 1));
  local_200[0] = XOR;
  local_208[1] = 9;
  local_208[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_200,local_208 + 1,local_208);
  local_20c = SHR;
  local_214[1] = 10;
  local_214[0] = NUMBER;
  local_21c[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_20c,local_214 + 1,local_214,(int *)(local_21c + 1));
  local_21c[0] = XOR;
  local_224[1] = 9;
  local_224[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_21c,local_224 + 1,local_224);
  local_228 = SHR;
  local_230[1] = 10;
  local_230[0] = NUMBER;
  local_238[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_228,local_230 + 1,local_230,(int *)(local_238 + 1));
  local_238[0] = XOR;
  local_240[1] = 9;
  local_240[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_238,local_240 + 1,local_240);
  local_244 = SHR;
  local_24c[1] = 10;
  local_24c[0] = NUMBER;
  local_254[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_244,local_24c + 1,local_24c,(int *)(local_254 + 1));
  local_254[0] = XOR;
  local_25c[1] = 9;
  local_25c[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_254,local_25c + 1,local_25c);
  local_260 = SHR;
  local_268[1] = 10;
  local_268[0] = NUMBER;
  local_270[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_260,local_268 + 1,local_268,(int *)(local_270 + 1));
  local_270[0] = XOR;
  local_278[1] = 9;
  local_278[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_270,local_278 + 1,local_278);
  local_27c = SHR;
  local_284[1] = 10;
  local_284[0] = NUMBER;
  local_28c[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_27c,local_284 + 1,local_284,(int *)(local_28c + 1));
  local_28c[0] = XOR;
  local_294[1] = 9;
  local_294[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_28c,local_294 + 1,local_294);
  local_298 = AND;
  local_2a0[1] = 9;
  local_2a0[0] = NUMBER;
  local_2a8[1] = 0xff;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_298,local_2a0 + 1,local_2a0,(int *)(local_2a8 + 1));
  local_2a8[0] = SHL;
  local_2b0[1] = 9;
  local_2b0[0] = NUMBER;
  local_2b8[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_2a8,local_2b0 + 1,local_2b0,(int *)(local_2b8 + 1));
  local_2b8[0] = POP;
  local_2bc = RDX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_2b8,&local_2bc);
  local_2c0 = POP;
  local_2c4 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_2c0,&local_2c4);
  local_2c8 = JMP;
  local_2cc = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_2c8,&local_2cc);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    error_label(code,(string *)local_38,re_string_hash_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)(done.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void compile_string_hash(asmcode& code, const compiler_options& ops)
  {

  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNE, error);
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xfffffffffffffff8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_string(code, asmcode::RCX, asmcode::R11, error);
    }

  code.add(asmcode::PUSH, asmcode::RBX);
  code.add(asmcode::PUSH, asmcode::RDX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::MEM_RCX);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, block_size_mask);
  code.add(asmcode::AND, asmcode::R11, asmcode::RAX);
  code.add(asmcode::ADD, asmcode::RCX, asmcode::NUMBER, CELLS(1));

  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX);
  code.add(asmcode::ADD, asmcode::RCX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, 3498574187);
  code.add(asmcode::MUL, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RBX, asmcode::RAX);

  auto repeat = label_to_string(label++);
  auto done = label_to_string(label++);

  code.add(asmcode::LABEL, repeat);
  code.add(asmcode::TEST, asmcode::R11, asmcode::R11);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX);
  code.add(asmcode::MUL, asmcode::R15);
  code.add(asmcode::XOR, asmcode::RBX, asmcode::RAX);
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RCX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::JMPS, repeat);
  code.add(asmcode::LABEL, done);

  code.add(asmcode::MOV, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 255);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::POP, asmcode::RDX);
  code.add(asmcode::POP, asmcode::RBX);
  code.add(asmcode::JMP, CONTINUE);

  if (ops.safe_primitives)
    {
    error_label(code, error, re_string_hash_contract_violation);
    }
  }